

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O1

int nonce_function_0(uchar *nonce32,uchar *msg,size_t msglen,uchar *key32,uchar *xonly_pk32,
                    uchar *algo,size_t algolen,void *data)

{
  nonce32[0x10] = '\0';
  nonce32[0x11] = '\0';
  nonce32[0x12] = '\0';
  nonce32[0x13] = '\0';
  nonce32[0x14] = '\0';
  nonce32[0x15] = '\0';
  nonce32[0x16] = '\0';
  nonce32[0x17] = '\0';
  nonce32[0x18] = '\0';
  nonce32[0x19] = '\0';
  nonce32[0x1a] = '\0';
  nonce32[0x1b] = '\0';
  nonce32[0x1c] = '\0';
  nonce32[0x1d] = '\0';
  nonce32[0x1e] = '\0';
  nonce32[0x1f] = '\0';
  nonce32[0] = '\0';
  nonce32[1] = '\0';
  nonce32[2] = '\0';
  nonce32[3] = '\0';
  nonce32[4] = '\0';
  nonce32[5] = '\0';
  nonce32[6] = '\0';
  nonce32[7] = '\0';
  nonce32[8] = '\0';
  nonce32[9] = '\0';
  nonce32[10] = '\0';
  nonce32[0xb] = '\0';
  nonce32[0xc] = '\0';
  nonce32[0xd] = '\0';
  nonce32[0xe] = '\0';
  nonce32[0xf] = '\0';
  return 1;
}

Assistant:

static int nonce_function_0(unsigned char *nonce32, const unsigned char *msg, size_t msglen, const unsigned char *key32, const unsigned char *xonly_pk32, const unsigned char *algo, size_t algolen, void *data) {
    (void) msg;
    (void) msglen;
    (void) key32;
    (void) xonly_pk32;
    (void) algo;
    (void) algolen;
    (void) data;

    memset(nonce32, 0, 32);
    return 1;
}